

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix3f.cpp
# Opt level: O2

void __thiscall Matrix3f::setSubmatrix2x2(Matrix3f *this,int i0,int j0,Matrix2f *m)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  long lVar4;
  int j;
  long lVar5;
  
  pfVar2 = this->m_elements + (long)i0 + (long)j0 * 3;
  for (lVar4 = 0; lVar4 != 2; lVar4 = lVar4 + 1) {
    pfVar3 = pfVar2;
    for (lVar5 = 0; lVar5 != 2; lVar5 = lVar5 + 1) {
      pfVar1 = Matrix2f::operator()(m,(int)lVar4,(int)lVar5);
      *pfVar3 = *pfVar1;
      pfVar3 = pfVar3 + 3;
    }
    pfVar2 = pfVar2 + 1;
  }
  return;
}

Assistant:

void Matrix3f::setSubmatrix2x2( int i0, int j0, const Matrix2f& m )
{
	for( int i = 0; i < 2; ++i )
	{
		for( int j = 0; j < 2; ++j )
		{
			( *this )( i + i0, j + j0 ) = m( i, j );
		}
	}
}